

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.cpp
# Opt level: O2

void * slang::detail::allocArray(size_t capacity,size_t typeSize)

{
  void *pvVar1;
  undefined8 *puVar2;
  
  pvVar1 = malloc(capacity * typeSize);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = std::filesystem::__cxx11::path::replace_extension;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void* allocArray(size_t capacity, size_t typeSize) {
    void* result = std::malloc(capacity * typeSize);
    if (!result)
        throw std::bad_alloc();

    return result;
}